

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_pollset_check(Curl_easy *data,easy_pollset *ps,curl_socket_t sock,_Bool *pwant_read,
                       _Bool *pwant_write)

{
  long lVar1;
  
  if (ps->num != 0) {
    lVar1 = 0;
    do {
      if (ps->sockets[lVar1] == sock) {
        *pwant_read = (_Bool)(ps->actions[lVar1] & 1);
        *pwant_write = (_Bool)(ps->actions[lVar1] >> 1 & 1);
        return;
      }
      lVar1 = lVar1 + 1;
    } while (ps->num != (uint)lVar1);
  }
  *pwant_write = false;
  *pwant_read = false;
  return;
}

Assistant:

void Curl_pollset_check(struct Curl_easy *data,
                        struct easy_pollset *ps, curl_socket_t sock,
                        bool *pwant_read, bool *pwant_write)
{
  unsigned int i;

  (void)data;
  DEBUGASSERT(VALID_SOCK(sock));
  for(i = 0; i < ps->num; ++i) {
    if(ps->sockets[i] == sock) {
      *pwant_read = !!(ps->actions[i] & CURL_POLL_IN);
      *pwant_write = !!(ps->actions[i] & CURL_POLL_OUT);
      return;
    }
  }
  *pwant_read = *pwant_write = FALSE;
}